

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univ_map_oa.hpp
# Opt level: O1

bool __thiscall lex_less<const_char_*>::operator()(lex_less<const_char_*> *this,char **x,char **y)

{
  char cVar1;
  char *__s;
  char *__s_00;
  difference_type __diff2;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  
  __s = *x;
  sVar2 = strlen(__s);
  __s_00 = *y;
  sVar3 = strlen(__s_00);
  if ((long)sVar3 < (long)sVar2) {
    sVar2 = sVar3;
  }
  pcVar4 = __s_00;
  if (sVar2 != 0) {
    pcVar4 = __s_00 + sVar2;
    sVar5 = 0;
    do {
      cVar1 = __s[sVar5];
      if (__s_00[sVar5] != cVar1) {
        return cVar1 < __s_00[sVar5];
      }
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  return pcVar4 != __s_00 + sVar3;
}

Assistant:

bool operator()(const T &x, const T &y) const
  {
    return (std::lexicographical_compare(x, x + strlen(x), y, y + strlen(y)));
  }